

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall
ProblemTest_IncompleteNonlinearCon_Test::TestBody(ProblemTest_IncompleteNonlinearCon_Test *this)

{
  pointer pBVar1;
  bool bVar2;
  ExprBase expr;
  char *message;
  MutAlgebraicCon MVar3;
  AssertionResult gtest_ar;
  Problem p;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  AssertHelper local_380;
  internal local_378 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  BasicProblem<mp::BasicProblemParams<int>_> local_368;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_368);
  MVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&local_368,0.0,1.0);
  expr.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                                 (&local_368.super_ExprFactory,42.0);
  if ((ExprBase)expr.impl_ != (ExprBase)0x0) {
    mp::BasicProblem<mp::BasicProblemParams<int>_>::SetNonlinearConExpr
              (MVar3.
               super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
               MVar3.
               super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_,
               (NumericExpr)expr.impl_);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&local_368,0.0,1.0);
  local_388.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  MVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(&local_368,1);
  pBVar1 = ((MVar3.
             super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
           nonlinear_cons_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)MVar3.
                   super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ <
      (ulong)((long)((MVar3.
                      super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->nonlinear_cons_).
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    local_380.data_ =
         (AssertHelperData *)
         pBVar1[MVar3.
                super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
         super_ExprBase.impl_;
  }
  else {
    local_380.data_ = (AssertHelperData *)0x0;
  }
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (local_378,"mp::NumericExpr()","p.algebraic_con(1).nonlinear_expr()",
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_388,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_380);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x154,message);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if (local_388.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_388.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_388.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_368);
  return;
}

Assistant:

TEST(ProblemTest, IncompleteNonlinearCon) {
  Problem p;
  p.AddCon(0, 1).set_nonlinear_expr(p.MakeNumericConstant(42));
  p.AddCon(0, 1);
  EXPECT_EQ(mp::NumericExpr(), p.algebraic_con(1).nonlinear_expr());
}